

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O3

bool __thiscall FileTree::findNode(FileTree *this,string *value,bool isFile,TreeNode **node_parent)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  TreeNode *pTVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  TreeNode **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = node_parent;
  split(&local_70,value,'/');
  if (local_70.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_70.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar6 = true;
  }
  else {
    pTVar7 = this->root->firstChild;
    uVar4 = 0;
    do {
      pcVar1 = local_70.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,
                 pcVar1 + local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_string_length);
      if (pTVar7 != (TreeNode *)0x0) {
        lVar3 = (long)local_70.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_70.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        do {
          if ((pTVar7->isFile == ((lVar3 >> 5) - 1U <= uVar4 && isFile)) &&
             (iVar2 = std::__cxx11::string::compare((string *)local_50), iVar2 == 0)) {
            *local_58 = pTVar7;
            pTVar7 = pTVar7->firstChild;
            bVar5 = 1;
            goto LAB_001197f1;
          }
          pTVar7 = pTVar7->nextSibling;
        } while (pTVar7 != (TreeNode *)0x0);
      }
      bVar5 = 0;
      pTVar7 = (TreeNode *)0x0;
LAB_001197f1:
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar6 = (bool)(bVar5 | pTVar7 != (TreeNode *)0x0);
    } while ((bVar6 != false) &&
            (uVar4 = uVar4 + 1,
            uVar4 < (ulong)((long)local_70.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5)));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return bVar6;
}

Assistant:

bool findNode(const std::string value, bool isFile, TreeNode*& node_parent)
    {
        std::vector<std::string> files = split(value, '/');

        TreeNode* node = root->firstChild;

        bool isFound = true;


        for (int i = 0; i < files.size(); i++)
        {
            bool isBreakFromWhile = false;

            std::string file = files[i];

            bool _isFile = isFile;
            if (i < files.size() - 1)
            {
                _isFile = false;
            }

            while (node != nullptr)
            {
                if (node->isFile == _isFile && file.compare(node->value) == 0)
                {
                    node_parent = node;
                    node = node->firstChild;
                    isBreakFromWhile = true;
                    break;
                }
                node = node->nextSibling;
            }
            if (!isBreakFromWhile)
            {
                if (node == nullptr)
                {
                    isFound = false;
                    break;
                }
            }

        }
        return isFound;
    }